

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
          (basic_streambuf<std::allocator<char>_> *this,size_t maximum_size,
          allocator<char> *allocator)

{
  unsigned_long *puVar1;
  reference pvVar2;
  reference pvVar3;
  undefined8 in_RSI;
  noncopyable *in_RDI;
  noncopyable *pnVar4;
  size_t pend;
  allocator_type *in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_type __n;
  unsigned_long local_30 [4];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::streambuf::streambuf(in_RDI);
  detail::noncopyable::noncopyable(in_RDI);
  *(undefined ***)in_RDI = &PTR__basic_streambuf_0020c978;
  *(undefined8 *)(in_RDI + 0x40) = local_10;
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_30[1] = 0x80;
  puVar1 = std::min<unsigned_long>((unsigned_long *)(in_RDI + 0x40),local_30 + 1);
  local_30[2] = *puVar1;
  local_30[0] = 1;
  std::max<unsigned_long>(local_30 + 2,local_30);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pnVar4 = in_RDI + 0x48;
  __n = 0;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)pnVar4,0);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)pnVar4,__n);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)pnVar4,__n);
  std::streambuf::setg((char *)in_RDI,pvVar2,pvVar3);
  pnVar4 = in_RDI + 0x48;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)pnVar4,0);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)pnVar4,0);
  std::streambuf::setp((char *)in_RDI,pvVar2);
  return;
}

Assistant:

explicit basic_streambuf(
      std::size_t maximum_size = (std::numeric_limits<std::size_t>::max)(),
      const Allocator& allocator = Allocator())
    : max_size_(maximum_size),
      buffer_(allocator)
  {
    std::size_t pend = (std::min<std::size_t>)(max_size_, buffer_delta);
    buffer_.resize((std::max<std::size_t>)(pend, 1));
    setg(&buffer_[0], &buffer_[0], &buffer_[0]);
    setp(&buffer_[0], &buffer_[0] + pend);
  }